

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::recompose
          (Normalizer2Impl *this,ReorderingBuffer *buffer,int32_t recomposeStartIndex,
          UBool onlyContiguous)

{
  UChar UVar1;
  bool bVar2;
  short sVar3;
  byte bVar4;
  UBool UVar5;
  uint16_t uVar6;
  uint uVar7;
  int c_00;
  UChar *pUVar8;
  int iVar9;
  int local_84;
  UChar local_72;
  UChar32 composite;
  UChar t;
  UChar syllable;
  UChar prev;
  uint16_t __c2;
  int32_t __index;
  UBool starterIsSupplementary;
  uint8_t prevCC;
  uint8_t cc;
  uint16_t norm16;
  UChar32 compositeAndFwd;
  UChar32 c;
  uint16_t *compositionsList;
  UChar *r;
  UChar *q;
  UChar *pRemove;
  UChar *starter;
  UChar *limit;
  UChar *p;
  UBool onlyContiguous_local;
  int32_t recomposeStartIndex_local;
  ReorderingBuffer *buffer_local;
  Normalizer2Impl *this_local;
  
  pUVar8 = ReorderingBuffer::getStart(buffer);
  limit = pUVar8 + recomposeStartIndex;
  starter = ReorderingBuffer::getLimit(buffer);
  if (limit != starter) {
    _compositeAndFwd = (uint16_t *)0x0;
    pRemove = (UChar *)0x0;
    bVar2 = false;
    __index._0_1_ = 0;
LAB_00340d2e:
    while( true ) {
      pUVar8 = limit + 1;
      _prevCC = (uint)(ushort)*limit;
      if ((_prevCC & 0xfffff800) == 0xd800) {
        if ((((*limit & 0x400U) == 0) && (pUVar8 != starter)) && ((*pUVar8 & 0xfc00U) == 0xdc00)) {
          _prevCC = _prevCC * 0x400 + (uint)(ushort)*pUVar8 + 0xfca02400;
          if ((int)_prevCC < this->normTrie->highStart) {
            local_84 = ucptrie_internalSmallIndex_63(this->normTrie,_prevCC);
          }
          else {
            local_84 = this->normTrie->dataLength + -2;
          }
          _t = local_84;
          limit = limit + 2;
        }
        else {
          _t = this->normTrie->dataLength + -1;
          limit = pUVar8;
        }
      }
      else {
        _t = (uint)this->normTrie->index[(int)_prevCC >> 6] + (_prevCC & 0x3f);
        limit = pUVar8;
      }
      uVar6 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)_t * 2);
      bVar4 = getCCFromYesOrMaybe(uVar6);
      UVar5 = isMaybe(this,uVar6);
      if (((UVar5 == '\0') || (_compositeAndFwd == (uint16_t *)0x0)) ||
         ((bVar4 <= (byte)__index && ((byte)__index != 0)))) break;
      UVar5 = isJamoVT(uVar6);
      if (UVar5 == '\0') {
        uVar7 = combine(_compositeAndFwd,_prevCC);
        if ((int)uVar7 < 0) break;
        c_00 = (int)uVar7 >> 1;
        iVar9 = 2;
        if (_prevCC < 0x10000) {
          iVar9 = 1;
        }
        q = limit + -(long)iVar9;
        sVar3 = (short)((int)uVar7 >> 0xb);
        UVar1 = (UChar)c_00;
        if (bVar2) {
          if (c_00 - 0x10000U < 0x100000) {
            *pRemove = sVar3 + L'ퟀ';
            pRemove[1] = UVar1 & 0x3ffU | 0xdc00;
          }
          else {
            *pRemove = UVar1;
            bVar2 = false;
            compositionsList = (uint16_t *)(pRemove + 2);
            r = pRemove;
            while (r = r + 1, compositionsList < q) {
              *r = *compositionsList;
              compositionsList = compositionsList + 1;
            }
            q = q + -1;
          }
        }
        else if (c_00 - 0x10000U < 0x100000) {
          bVar2 = true;
          compositionsList = (uint16_t *)(q + 1);
          r = q;
          while (pRemove + 1 < r) {
            compositionsList[-1] = r[-1];
            compositionsList = compositionsList + -1;
            r = r + -1;
          }
          pRemove[1] = UVar1 & 0x3ffU | 0xdc00;
          *pRemove = sVar3 + L'ퟀ';
          q = q + 1;
        }
        else {
          *pRemove = UVar1;
        }
        if (q < limit) {
          r = q;
          compositionsList = (uint16_t *)limit;
          while (compositionsList < starter) {
            *r = *compositionsList;
            compositionsList = compositionsList + 1;
            r = r + 1;
          }
          starter = r;
          limit = q;
        }
        if (limit == starter) goto LAB_00341264;
        if ((uVar7 & 1) == 0) {
          _compositeAndFwd = (uint16_t *)0x0;
        }
        else {
          uVar6 = getRawNorm16(this,c_00);
          _compositeAndFwd = getCompositionsListForComposite(this,uVar6);
        }
      }
      else {
        if (((int)_prevCC < 0x11a7) && ((ushort)(*pRemove + L'\xef00') < 0x13)) {
          pUVar8 = limit + -1;
          local_72 = ((*pRemove + L'\xef00') * 0x15 + (short)_prevCC + -0x1161) * 0x1c + L'가';
          if ((limit != starter) && (UVar1 = *limit, (ushort)(UVar1 + L'\xee59') < 0x1c)) {
            limit = limit + 1;
            local_72 = local_72 + UVar1 + L'\xee59';
          }
          *pRemove = local_72;
          compositionsList = (uint16_t *)limit;
          r = pUVar8;
          while (compositionsList < starter) {
            *r = *compositionsList;
            compositionsList = compositionsList + 1;
            r = r + 1;
          }
          starter = r;
          limit = pUVar8;
        }
        if (limit == starter) goto LAB_00341264;
        _compositeAndFwd = (uint16_t *)0x0;
      }
    }
    if (limit != starter) {
      __index._0_1_ = bVar4;
      if (bVar4 == 0) {
        _compositeAndFwd = getCompositionsListForDecompYes(this,uVar6);
        if (_compositeAndFwd != (uint16_t *)0x0) {
          bVar2 = 0xffff < _prevCC;
          if (bVar2) {
            pRemove = limit + -2;
          }
          else {
            pRemove = limit + -1;
          }
        }
      }
      else if (onlyContiguous != '\0') {
        _compositeAndFwd = (uint16_t *)0x0;
      }
      goto LAB_00340d2e;
    }
LAB_00341264:
    ReorderingBuffer::setReorderingLimit(buffer,starter);
  }
  return;
}

Assistant:

void Normalizer2Impl::recompose(ReorderingBuffer &buffer, int32_t recomposeStartIndex,
                                UBool onlyContiguous) const {
    UChar *p=buffer.getStart()+recomposeStartIndex;
    UChar *limit=buffer.getLimit();
    if(p==limit) {
        return;
    }

    UChar *starter, *pRemove, *q, *r;
    const uint16_t *compositionsList;
    UChar32 c, compositeAndFwd;
    uint16_t norm16;
    uint8_t cc, prevCC;
    UBool starterIsSupplementary;

    // Some of the following variables are not used until we have a forward-combining starter
    // and are only initialized now to avoid compiler warnings.
    compositionsList=NULL;  // used as indicator for whether we have a forward-combining starter
    starter=NULL;
    starterIsSupplementary=FALSE;
    prevCC=0;

    for(;;) {
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        cc=getCCFromYesOrMaybe(norm16);
        if( // this character combines backward and
            isMaybe(norm16) &&
            // we have seen a starter that combines forward and
            compositionsList!=NULL &&
            // the backward-combining character is not blocked
            (prevCC<cc || prevCC==0)
        ) {
            if(isJamoVT(norm16)) {
                // c is a Jamo V/T, see if we can compose it with the previous character.
                if(c<Hangul::JAMO_T_BASE) {
                    // c is a Jamo Vowel, compose with previous Jamo L and following Jamo T.
                    UChar prev=(UChar)(*starter-Hangul::JAMO_L_BASE);
                    if(prev<Hangul::JAMO_L_COUNT) {
                        pRemove=p-1;
                        UChar syllable=(UChar)
                            (Hangul::HANGUL_BASE+
                             (prev*Hangul::JAMO_V_COUNT+(c-Hangul::JAMO_V_BASE))*
                             Hangul::JAMO_T_COUNT);
                        UChar t;
                        if(p!=limit && (t=(UChar)(*p-Hangul::JAMO_T_BASE))<Hangul::JAMO_T_COUNT) {
                            ++p;
                            syllable+=t;  // The next character was a Jamo T.
                        }
                        *starter=syllable;
                        // remove the Jamo V/T
                        q=pRemove;
                        r=p;
                        while(r<limit) {
                            *q++=*r++;
                        }
                        limit=q;
                        p=pRemove;
                    }
                }
                /*
                 * No "else" for Jamo T:
                 * Since the input is in NFD, there are no Hangul LV syllables that
                 * a Jamo T could combine with.
                 * All Jamo Ts are combined above when handling Jamo Vs.
                 */
                if(p==limit) {
                    break;
                }
                compositionsList=NULL;
                continue;
            } else if((compositeAndFwd=combine(compositionsList, c))>=0) {
                // The starter and the combining mark (c) do combine.
                UChar32 composite=compositeAndFwd>>1;

                // Replace the starter with the composite, remove the combining mark.
                pRemove=p-U16_LENGTH(c);  // pRemove & p: start & limit of the combining mark
                if(starterIsSupplementary) {
                    if(U_IS_SUPPLEMENTARY(composite)) {
                        // both are supplementary
                        starter[0]=U16_LEAD(composite);
                        starter[1]=U16_TRAIL(composite);
                    } else {
                        *starter=(UChar)composite;
                        // The composite is shorter than the starter,
                        // move the intermediate characters forward one.
                        starterIsSupplementary=FALSE;
                        q=starter+1;
                        r=q+1;
                        while(r<pRemove) {
                            *q++=*r++;
                        }
                        --pRemove;
                    }
                } else if(U_IS_SUPPLEMENTARY(composite)) {
                    // The composite is longer than the starter,
                    // move the intermediate characters back one.
                    starterIsSupplementary=TRUE;
                    ++starter;  // temporarily increment for the loop boundary
                    q=pRemove;
                    r=++pRemove;
                    while(starter<q) {
                        *--r=*--q;
                    }
                    *starter=U16_TRAIL(composite);
                    *--starter=U16_LEAD(composite);  // undo the temporary increment
                } else {
                    // both are on the BMP
                    *starter=(UChar)composite;
                }

                /* remove the combining mark by moving the following text over it */
                if(pRemove<p) {
                    q=pRemove;
                    r=p;
                    while(r<limit) {
                        *q++=*r++;
                    }
                    limit=q;
                    p=pRemove;
                }
                // Keep prevCC because we removed the combining mark.

                if(p==limit) {
                    break;
                }
                // Is the composite a starter that combines forward?
                if(compositeAndFwd&1) {
                    compositionsList=
                        getCompositionsListForComposite(getRawNorm16(composite));
                } else {
                    compositionsList=NULL;
                }

                // We combined; continue with looking for compositions.
                continue;
            }
        }

        // no combination this time
        prevCC=cc;
        if(p==limit) {
            break;
        }

        // If c did not combine, then check if it is a starter.
        if(cc==0) {
            // Found a new starter.
            if((compositionsList=getCompositionsListForDecompYes(norm16))!=NULL) {
                // It may combine with something, prepare for it.
                if(U_IS_BMP(c)) {
                    starterIsSupplementary=FALSE;
                    starter=p-1;
                } else {
                    starterIsSupplementary=TRUE;
                    starter=p-2;
                }
            }
        } else if(onlyContiguous) {
            // FCC: no discontiguous compositions; any intervening character blocks.
            compositionsList=NULL;
        }
    }
    buffer.setReorderingLimit(limit);
}